

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

int luaV_tonumber_(TValue *obj,lua_Number *n)

{
  size_t sVar1;
  Value local_48;
  ulong local_40;
  Value local_30;
  TValue v;
  lua_Number *n_local;
  TValue *obj_local;
  
  if (obj->tt_ == 0x13) {
    *n = (double)(obj->value_).i;
    obj_local._4_4_ = 1;
  }
  else {
    if ((obj->tt_ & 0xfU) == 4) {
      v._8_8_ = n;
      sVar1 = luaO_str2num((char *)((obj->value_).f + 0x18),(TValue *)&local_30);
      if (((obj->value_).gc)->tt == '\x04') {
        local_40 = (ulong)(byte)(obj->value_).f[0xb];
      }
      else {
        local_40 = *(ulong *)((obj->value_).f + 0x10);
      }
      if (sVar1 == local_40 + 1) {
        if (v.value_.b == 0x13) {
          local_48.n = (lua_Number)local_30.i;
        }
        else {
          local_48.gc = local_30.gc;
        }
        *(Value *)v._8_8_ = local_48;
        return 1;
      }
    }
    obj_local._4_4_ = 0;
  }
  return obj_local._4_4_;
}

Assistant:

int luaV_tonumber_(const TValue *obj, lua_Number *n) {
    TValue v;
    if (ttisinteger(obj)) {
        *n = cast_num(ivalue(obj));
        return 1;
    } else if (cvt2num(obj) &&  /* string convertible to number? */
               luaO_str2num(svalue(obj), &v) == vslen(obj) + 1) {
        *n = nvalue(&v);  /* convert result of 'luaO_str2num' to a float */
        return 1;
    } else
        return 0;  /* conversion failed */
}